

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall
llvm::detail::IEEEFloat::toString
          (IEEEFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding,
          bool TruncateZero)

{
  char cVar1;
  short sVar2;
  long lVar3;
  SmallVectorImpl<char> *pSVar4;
  bool bVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  Significand *pSVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  undefined3 in_register_00000081;
  undefined4 uVar14;
  uint uVar15;
  byte bVar16;
  undefined1 uVar17;
  uint uVar18;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  ArrayRef<unsigned_long> bigVal;
  APInt significand;
  APInt powten;
  APInt ten;
  APInt digit;
  SmallVector<char,_256U> buffer;
  byte local_1a9;
  anon_union_8_2_1313ab2f_for_U local_1a8;
  uint local_1a0;
  anon_union_8_2_1313ab2f_for_U local_198;
  ulong local_190;
  undefined1 local_188 [8];
  SmallVectorImpl<char> *local_180;
  uint local_174;
  ulong local_170;
  undefined4 local_164;
  anon_union_8_2_1313ab2f_for_U local_160;
  uint local_158;
  anon_union_8_2_1313ab2f_for_U local_150;
  uint local_148;
  anon_union_8_2_1313ab2f_for_U local_140;
  ulong local_138;
  char local_130 [256];
  
  uVar14 = CONCAT31(in_register_00000081,TruncateZero);
  uVar11 = (ulong)FormatPrecision;
  bVar16 = this->field_0x12;
  local_180 = Str;
  if ((bVar16 & 7) == 3) {
    if ((bVar16 & 8) != 0) {
      local_140.VAL._0_1_ = 0x2d;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
    }
    if (FormatMaxPadding != 0) {
      local_140.VAL._0_1_ = 0x30;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
      return;
    }
    if (TruncateZero) {
      pcVar13 = "0.0E+0";
      pcVar9 = "";
    }
    else {
      SmallVectorImpl<char>::append<char_const*,void>(Str,"0.0","");
      if (1 < FormatPrecision) {
        local_140.VAL._0_1_ = 0x30;
        SmallVectorImpl<char>::append(Str,(ulong)(FormatPrecision - 1),(char *)&local_140.VAL);
      }
      pcVar13 = "e+00";
      pcVar9 = "";
    }
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar13,pcVar9);
    return;
  }
  if ((bVar16 & 7) == 1) {
    pcVar13 = "NaN";
    pcVar9 = "";
LAB_0019668d:
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar13,pcVar9);
    return;
  }
  if ((bVar16 & 7) == 0) {
    if ((bVar16 & 8) == 0) {
      pcVar13 = "+Inf";
      pcVar9 = "";
    }
    else {
      pcVar13 = "-Inf";
      pcVar9 = "";
    }
    goto LAB_0019668d;
  }
  if ((bVar16 & 8) != 0) {
    local_140.VAL._0_1_ = 0x2d;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_140.VAL);
  }
  uVar18 = this->semantics->precision;
  if (uVar18 - 0x40 < 0xffffff80) {
    pSVar10 = (Significand *)(this->significand).part;
  }
  else {
    pSVar10 = &this->significand;
  }
  sVar2 = this->exponent;
  uVar15 = this->semantics->precision;
  bigVal.Length._0_4_ = uVar18 + 0x3f >> 6;
  bigVal.Data = (unsigned_long *)pSVar10;
  bigVal.Length._4_4_ = 0;
  local_174 = FormatMaxPadding;
  APInt::APInt((APInt *)&local_1a8,uVar18,bigVal);
  if (FormatPrecision == 0) {
    uVar11 = (ulong)((this->semantics->precision * 0x3b) / 0xc4 + 2);
  }
  if (local_1a0 < 0x41) {
    if ((void *)local_1a8.VAL == (void *)0x0) {
      uVar18 = 0x40;
    }
    else {
      lVar3 = 0;
      if ((void *)local_1a8.VAL != (void *)0x0) {
        for (; (local_1a8.VAL >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar18 = (uint)lVar3;
    }
    if (local_1a0 < uVar18) {
      uVar18 = local_1a0;
    }
  }
  else {
    uVar18 = APInt::countTrailingZerosSlowCase((APInt *)&local_1a8);
  }
  APInt::lshrInPlace((APInt *)&local_1a8,uVar18);
  uVar18 = ((int)sVar2 - uVar15) + uVar18 + 1;
  local_170 = uVar11;
  local_164 = uVar14;
  if (uVar18 != 0) {
    if ((int)uVar18 < 1) {
      uVar15 = this->semantics->precision;
      APInt::zext((APInt *)&local_140,(uint)&local_1a8);
      APInt::operator=((APInt *)&local_1a8,(APInt *)&local_140);
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
      uVar7 = -uVar18;
      APInt::APInt((APInt *)&local_140,(uVar18 * -0x89 + 0x88) / 0x3b + uVar15,5,false);
      uVar11 = local_170;
      while( true ) {
        if ((uVar7 & 1) != 0) {
          APInt::operator*=((APInt *)&local_1a8,(APInt *)&local_140);
        }
        if (uVar7 < 2) break;
        uVar7 = uVar7 >> 1;
        APInt::operator*=((APInt *)&local_140,(APInt *)&local_140);
      }
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
    }
    else {
      APInt::zext((APInt *)&local_140,(uint)&local_1a8);
      APInt::operator=((APInt *)&local_1a8,(APInt *)&local_140);
      if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
        operator_delete__(local_140.pVal);
      }
      APInt::operator<<=((APInt *)&local_1a8,uVar18);
      uVar18 = 0;
    }
  }
  uVar15 = local_1a0;
  if (local_1a0 < 0x41) {
    if ((void *)local_1a8.VAL == (void *)0x0) {
      uVar7 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if ((void *)local_1a8.VAL != (void *)0x0) {
        for (; local_1a8.VAL >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar7 = (uint)lVar3 ^ 0x3f;
    }
    uVar7 = (local_1a0 - 0x40) + uVar7;
  }
  else {
    uVar7 = APInt::countLeadingZerosSlowCase((APInt *)&local_1a8);
  }
  uVar7 = uVar15 - uVar7;
  uVar12 = ((int)uVar11 * 0xc4 + 0x3aU) / 0x3b;
  iVar8 = uVar7 - uVar12;
  if ((uVar12 <= uVar7 && iVar8 != 0) && (uVar7 = iVar8 * 0x3b, 0xc3 < uVar7)) {
    APInt::APInt((APInt *)&local_140,uVar15,1,false);
    APInt::APInt((APInt *)&local_198,local_1a0,10,false);
    uVar7 = uVar7 / 0xc4;
    uVar15 = uVar7;
    while( true ) {
      if ((uVar15 & 1) != 0) {
        APInt::operator*=((APInt *)&local_140,(APInt *)&local_198);
      }
      if (uVar15 < 2) break;
      uVar15 = uVar15 >> 1;
      APInt::operator*=((APInt *)&local_198,(APInt *)&local_198);
    }
    APInt::udiv((APInt *)&local_160,(APInt *)&local_1a8);
    APInt::operator=((APInt *)&local_1a8,(APInt *)&local_160);
    __x = extraout_XMM0_Qa;
    if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
      operator_delete__(local_160.pVal);
      __x = extraout_XMM0_Qa_00;
    }
    if (local_1a0 < 0x41) {
      if (((void *)local_1a8.VAL != (void *)0x0) &&
         (lVar3 = 0x3f, (void *)local_1a8.VAL != (void *)0x0)) {
        for (; local_1a8.VAL >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
    }
    else {
      APInt::countLeadingZerosSlowCase((APInt *)&local_1a8);
      __x = extraout_XMM0_Qa_01;
    }
    APInt::trunc((APInt *)&local_160,__x);
    APInt::operator=((APInt *)&local_1a8,(APInt *)&local_160);
    if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
      operator_delete__(local_160.pVal);
    }
    if ((0x40 < (uint)local_190) && ((undefined1 *)local_198.VAL != (undefined1 *)0x0)) {
      operator_delete__(local_198.pVal);
    }
    if ((0x40 < (uint)local_138) && ((void *)local_140.VAL != (void *)0x0)) {
      operator_delete__(local_140.pVal);
    }
    uVar18 = uVar7 + uVar18;
  }
  uVar15 = local_1a0;
  local_140.pVal = (uint64_t *)local_130;
  local_138 = 0x10000000000;
  APInt::APInt((APInt *)&local_160,local_1a0,10,false);
  APInt::APInt((APInt *)&local_150,uVar15,0,false);
  bVar5 = APInt::operator==((APInt *)&local_1a8,0);
  if (!bVar5) {
    bVar16 = 1;
    do {
      APInt::udivrem((APInt *)&local_1a8,(APInt *)&local_160,(APInt *)&local_1a8,(APInt *)&local_150
                    );
      uVar6 = APInt::getZExtValue((APInt *)&local_150);
      if ((bool)((int)uVar6 != 0 | ~bVar16 & 1)) {
        local_198.VAL._0_1_ = (char)uVar6 + '0';
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&local_140,(char *)&local_198.VAL);
        bVar16 = 0;
      }
      else {
        uVar18 = uVar18 + 1;
      }
      bVar5 = APInt::operator==((APInt *)&local_1a8,0);
    } while (!bVar5);
  }
  uVar14 = local_164;
  pSVar4 = local_180;
  if ((uint)local_138 == 0) {
    __assert_fail("!buffer.empty() && \"no characters in buffer!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xdbd,
                  "void llvm::detail::IEEEFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
                 );
  }
  uVar15 = (uint)local_138 - (uint)local_170;
  if ((uint)local_170 <= (uint)local_138 && uVar15 != 0) {
    if ((uint)local_138 <= uVar15 - 1) goto LAB_00196f63;
    if (*(char *)((long)local_140.pVal + (ulong)(uVar15 - 1)) < '5') {
      if ((uint)local_170 <= (uint)local_138) {
        pcVar9 = (char *)((ulong)uVar15 + (long)local_140.pVal);
        uVar11 = local_170;
        do {
          if (*pcVar9 != '0') {
            uVar15 = (uint)local_138 - (int)uVar11;
            break;
          }
          pcVar9 = pcVar9 + 1;
          uVar7 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar7;
          uVar15 = (uint)local_138;
        } while (uVar7 != 0);
      }
      if ((uint)local_138 <= uVar15) goto LAB_00196f63;
      uVar18 = uVar18 + uVar15;
    }
    else {
      iVar8 = -(uint)local_170;
      do {
        if (iVar8 == 0) goto LAB_00196f63;
        uVar15 = (uint)local_138 + iVar8;
        cVar1 = *(char *)((long)local_140.pVal + (ulong)uVar15);
        if (cVar1 != '9') {
          *(char *)((long)local_140.pVal + (ulong)uVar15) = cVar1 + '\x01';
          break;
        }
        iVar8 = iVar8 + 1;
        uVar15 = (uint)local_138;
      } while (iVar8 != 0);
      uVar18 = uVar18 + uVar15;
      if (uVar15 == (uint)local_138) {
        local_138 = local_138 & 0xffffffff00000000;
        local_198.VAL._0_1_ = 0x31;
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&local_140,(char *)&local_198.VAL);
        goto LAB_00196c03;
      }
      if (((uint)local_138 == 0) || ((uint)local_138 <= uVar15)) goto LAB_00196f63;
    }
    SmallVectorImpl<char>::erase
              ((SmallVectorImpl<char> *)&local_140,(const_iterator)local_140.pVal,
               (const_iterator)((ulong)uVar15 + (long)local_140.pVal));
  }
LAB_00196c03:
  uVar15 = (uint)local_138;
  uVar11 = local_138 & 0xffffffff;
  if (local_174 != 0) {
    if ((int)uVar18 < 0) {
      bVar5 = local_174 < 1 - ((uint)local_138 + uVar18) && (int)((uint)local_138 + uVar18 + -1) < 0
      ;
    }
    else {
      bVar5 = (uint)local_170 < (uint)local_138 + uVar18 || local_174 < uVar18;
    }
    if (!bVar5) {
      if ((int)uVar18 < 0) {
        uVar7 = uVar18 + (uint)local_138;
        if (uVar7 == 0 || SCARRY4(uVar18,(uint)local_138) != (int)uVar7 < 0) {
          local_198.VAL._0_1_ = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
          local_198.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
          uVar11 = 0;
          if (uVar7 != 0) {
            do {
              local_198.VAL._0_1_ = 0x30;
              SmallVectorTemplateBase<char,_true>::push_back
                        (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
              uVar7 = uVar7 + 1;
            } while (uVar7 != 0);
          }
        }
        else {
          uVar11 = 0;
          uVar18 = (uint)local_138;
          do {
            uVar18 = uVar18 - 1;
            if ((uint)local_138 <= uVar18) goto LAB_00196f63;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((ulong)uVar18 + (long)local_140.pVal));
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
          local_198.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
        }
        if ((uint)uVar11 != uVar15) {
          uVar15 = ~(uint)uVar11 + uVar15;
          do {
            if ((uint)local_138 <= uVar15) goto LAB_00196f63;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((ulong)uVar15 + (long)local_140.pVal));
            bVar5 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar5);
        }
      }
      else {
        for (; uVar11 != 0; uVar11 = uVar11 - 1) {
          if ((uint)local_138 <= (uint)(uVar11 - 1)) goto LAB_00196f63;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((uVar11 - 1 & 0xffffffff) + (long)local_140.pVal));
        }
        if (uVar18 != 0) {
          do {
            local_198.VAL._0_1_ = 0x30;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
        }
      }
      goto LAB_00196ef8;
    }
  }
  uVar7 = (uint)local_138 - 1;
  if ((uint)local_138 == 0) {
LAB_00196f63:
    __assert_fail("idx < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x9b,
                  "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                 );
  }
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
             (char *)((ulong)uVar7 + (long)local_140.pVal));
  local_198.VAL._0_1_ = 0x2e;
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
  if ((uVar15 == 1 & (byte)uVar14) == 0) {
    if (uVar15 != 1) {
      uVar12 = uVar15 - 2;
      do {
        if ((uint)local_138 <= uVar12) goto LAB_00196f63;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
                   (char *)((ulong)uVar12 + (long)local_140.pVal));
        bVar5 = uVar12 != 0;
        uVar12 = uVar12 - 1;
      } while (bVar5);
    }
  }
  else {
    local_198.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
  }
  uVar18 = uVar7 + uVar18;
  uVar17 = 0x45;
  if ((byte)uVar14 == 0) {
    uVar17 = 0x65;
    if (uVar7 < (uint)local_170) {
      local_198.VAL._0_1_ = 0x30;
      SmallVectorImpl<char>::append
                (pSVar4,(ulong)(((uint)local_170 - uVar15) + 1),(char *)&local_198.VAL);
    }
  }
  local_198.VAL._0_1_ = uVar17;
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
  local_198.VAL._0_1_ = (char)((int)uVar18 >> 0x1f) * -2 + '+';
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar4->super_SmallVectorTemplateBase<char,_true>,(char *)&local_198.VAL);
  uVar15 = -uVar18;
  if (0 < (int)uVar18) {
    uVar15 = uVar18;
  }
  local_190 = 0x600000000;
  local_198.pVal = (uint64_t *)local_188;
  do {
    local_1a9 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&local_198,(char *)&local_1a9);
    bVar5 = 9 < uVar15;
    uVar15 = uVar15 / 10;
  } while (bVar5);
  if (((char)local_164 == '\0') && ((uint)local_190 < 2)) {
    local_1a9 = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&local_198,(char *)&local_1a9);
  }
  pSVar4 = local_180;
  for (uVar11 = local_190 & 0xffffffff; uVar11 != 0; uVar11 = uVar11 - 1) {
    if ((uint)local_190 <= (uint)(uVar11 - 1)) goto LAB_00196f63;
    SmallVectorTemplateBase<char,_true>::push_back
              (&pSVar4->super_SmallVectorTemplateBase<char,_true>,
               (char *)((uVar11 - 1 & 0xffffffff) + (long)local_198.pVal));
  }
  if ((undefined1 *)local_198.VAL != local_188) {
    free(local_198.pVal);
  }
LAB_00196ef8:
  if ((0x40 < local_148) && ((void *)local_150.VAL != (void *)0x0)) {
    operator_delete__(local_150.pVal);
  }
  if ((0x40 < local_158) && ((void *)local_160.VAL != (void *)0x0)) {
    operator_delete__(local_160.pVal);
  }
  if ((char *)local_140.VAL != local_130) {
    free(local_140.pVal);
  }
  if ((0x40 < local_1a0) && ((void *)local_1a8.VAL != (void *)0x0)) {
    operator_delete__(local_1a8.pVal);
  }
  return;
}

Assistant:

void IEEEFloat::toString(SmallVectorImpl<char> &Str, unsigned FormatPrecision,
                         unsigned FormatMaxPadding, bool TruncateZero) const {
  switch (category) {
  case fcInfinity:
    if (isNegative())
      return append(Str, "-Inf");
    else
      return append(Str, "+Inf");

  case fcNaN: return append(Str, "NaN");

  case fcZero:
    if (isNegative())
      Str.push_back('-');

    if (!FormatMaxPadding) {
      if (TruncateZero)
        append(Str, "0.0E+0");
      else {
        append(Str, "0.0");
        if (FormatPrecision > 1)
          Str.append(FormatPrecision - 1, '0');
        append(Str, "e+00");
      }
    } else
      Str.push_back('0');
    return;

  case fcNormal:
    break;
  }

  if (isNegative())
    Str.push_back('-');

  // Decompose the number into an APInt and an exponent.
  int exp = exponent - ((int) semantics->precision - 1);
  APInt significand(semantics->precision,
                    makeArrayRef(significandParts(),
                                 partCountForBits(semantics->precision)));

  // Set FormatPrecision if zero.  We want to do this before we
  // truncate trailing zeros, as those are part of the precision.
  if (!FormatPrecision) {
    // We use enough digits so the number can be round-tripped back to an
    // APFloat. The formula comes from "How to Print Floating-Point Numbers
    // Accurately" by Steele and White.
    // FIXME: Using a formula based purely on the precision is conservative;
    // we can print fewer digits depending on the actual value being printed.

    // FormatPrecision = 2 + floor(significandBits / lg_2(10))
    FormatPrecision = 2 + semantics->precision * 59 / 196;
  }

  // Ignore trailing binary zeros.
  int trailingZeros = significand.countTrailingZeros();
  exp += trailingZeros;
  significand.lshrInPlace(trailingZeros);

  // Change the exponent from 2^e to 10^e.
  if (exp == 0) {
    // Nothing to do.
  } else if (exp > 0) {
    // Just shift left.
    significand = significand.zext(semantics->precision + exp);
    significand <<= exp;
    exp = 0;
  } else { /* exp < 0 */
    int texp = -exp;

    // We transform this using the identity:
    //   (N)(2^-e) == (N)(5^e)(10^-e)
    // This means we have to multiply N (the significand) by 5^e.
    // To avoid overflow, we have to operate on numbers large
    // enough to store N * 5^e:
    //   log2(N * 5^e) == log2(N) + e * log2(5)
    //                 <= semantics->precision + e * 137 / 59
    //   (log_2(5) ~ 2.321928 < 2.322034 ~ 137/59)

    unsigned precision = semantics->precision + (137 * texp + 136) / 59;

    // Multiply significand by 5^e.
    //   N * 5^0101 == N * 5^(1*1) * 5^(0*2) * 5^(1*4) * 5^(0*8)
    significand = significand.zext(precision);
    APInt five_to_the_i(precision, 5);
    while (true) {
      if (texp & 1) significand *= five_to_the_i;

      texp >>= 1;
      if (!texp) break;
      five_to_the_i *= five_to_the_i;
    }
  }

  AdjustToPrecision(significand, exp, FormatPrecision);

  SmallVector<char, 256> buffer;

  // Fill the buffer.
  unsigned precision = significand.getBitWidth();
  APInt ten(precision, 10);
  APInt digit(precision, 0);

  bool inTrail = true;
  while (significand != 0) {
    // digit <- significand % 10
    // significand <- significand / 10
    APInt::udivrem(significand, ten, significand, digit);

    unsigned d = digit.getZExtValue();

    // Drop trailing zeros.
    if (inTrail && !d) exp++;
    else {
      buffer.push_back((char) ('0' + d));
      inTrail = false;
    }
  }

  assert(!buffer.empty() && "no characters in buffer!");

  // Drop down to FormatPrecision.
  // TODO: don't do more precise calculations above than are required.
  AdjustToPrecision(buffer, exp, FormatPrecision);

  unsigned NDigits = buffer.size();

  // Check whether we should use scientific notation.
  bool FormatScientific;
  if (!FormatMaxPadding)
    FormatScientific = true;
  else {
    if (exp >= 0) {
      // 765e3 --> 765000
      //              ^^^
      // But we shouldn't make the number look more precise than it is.
      FormatScientific = ((unsigned) exp > FormatMaxPadding ||
                          NDigits + (unsigned) exp > FormatPrecision);
    } else {
      // Power of the most significant digit.
      int MSD = exp + (int) (NDigits - 1);
      if (MSD >= 0) {
        // 765e-2 == 7.65
        FormatScientific = false;
      } else {
        // 765e-5 == 0.00765
        //           ^ ^^
        FormatScientific = ((unsigned) -MSD) > FormatMaxPadding;
      }
    }
  }

  // Scientific formatting is pretty straightforward.
  if (FormatScientific) {
    exp += (NDigits - 1);

    Str.push_back(buffer[NDigits-1]);
    Str.push_back('.');
    if (NDigits == 1 && TruncateZero)
      Str.push_back('0');
    else
      for (unsigned I = 1; I != NDigits; ++I)
        Str.push_back(buffer[NDigits-1-I]);
    // Fill with zeros up to FormatPrecision.
    if (!TruncateZero && FormatPrecision > NDigits - 1)
      Str.append(FormatPrecision - NDigits + 1, '0');
    // For !TruncateZero we use lower 'e'.
    Str.push_back(TruncateZero ? 'E' : 'e');

    Str.push_back(exp >= 0 ? '+' : '-');
    if (exp < 0) exp = -exp;
    SmallVector<char, 6> expbuf;
    do {
      expbuf.push_back((char) ('0' + (exp % 10)));
      exp /= 10;
    } while (exp);
    // Exponent always at least two digits if we do not truncate zeros.
    if (!TruncateZero && expbuf.size() < 2)
      expbuf.push_back('0');
    for (unsigned I = 0, E = expbuf.size(); I != E; ++I)
      Str.push_back(expbuf[E-1-I]);
    return;
  }

  // Non-scientific, positive exponents.
  if (exp >= 0) {
    for (unsigned I = 0; I != NDigits; ++I)
      Str.push_back(buffer[NDigits-1-I]);
    for (unsigned I = 0; I != (unsigned) exp; ++I)
      Str.push_back('0');
    return;
  }

  // Non-scientific, negative exponents.

  // The number of digits to the left of the decimal point.
  int NWholeDigits = exp + (int) NDigits;

  unsigned I = 0;
  if (NWholeDigits > 0) {
    for (; I != (unsigned) NWholeDigits; ++I)
      Str.push_back(buffer[NDigits-I-1]);
    Str.push_back('.');
  } else {
    unsigned NZeros = 1 + (unsigned) -NWholeDigits;

    Str.push_back('0');
    Str.push_back('.');
    for (unsigned Z = 1; Z != NZeros; ++Z)
      Str.push_back('0');
  }

  for (; I != NDigits; ++I)
    Str.push_back(buffer[NDigits-I-1]);
}